

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

float deqp::gles3::Functional::MatrixCaseUtils::determinant<4>(Matrix<float,_4,_4> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int row_3;
  float *pfVar8;
  int row_2;
  int row_1;
  float *pfVar9;
  int row;
  long lVar10;
  int col_1;
  float *pfVar11;
  int col;
  long lVar12;
  float minorMatrices [4] [9];
  float local_158 [12];
  float local_128 [12];
  float local_f8 [12];
  float local_c8 [12];
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_98 = (mat->m_data).m_data[1].m_data[1];
  pfVar8 = &local_74;
  local_94 = (mat->m_data).m_data[1].m_data[2];
  local_90 = (mat->m_data).m_data[1].m_data[3];
  local_8c = (mat->m_data).m_data[2].m_data[1];
  local_88 = (mat->m_data).m_data[2].m_data[2];
  local_84 = (mat->m_data).m_data[2].m_data[3];
  local_80 = (mat->m_data).m_data[3].m_data[1];
  local_7c = (mat->m_data).m_data[3].m_data[2];
  local_78 = (mat->m_data).m_data[3].m_data[3];
  local_74 = (mat->m_data).m_data[0].m_data[1];
  local_70 = (mat->m_data).m_data[0].m_data[2];
  local_6c = (mat->m_data).m_data[0].m_data[3];
  local_68 = local_8c;
  local_64 = local_88;
  local_60 = local_84;
  local_5c = local_80;
  local_58 = local_7c;
  local_54 = local_78;
  pfVar6 = &local_50;
  local_50 = local_74;
  local_4c = local_70;
  local_48 = local_6c;
  local_44 = local_98;
  local_40 = local_94;
  local_3c = local_90;
  local_38 = local_80;
  local_34 = local_7c;
  local_30 = local_78;
  pfVar5 = &local_2c;
  local_2c = local_74;
  local_28 = local_70;
  local_24 = local_6c;
  local_20 = local_98;
  local_1c = local_94;
  local_18 = local_90;
  local_14 = local_8c;
  local_10 = local_88;
  local_c = local_84;
  fVar1 = (mat->m_data).m_data[0].m_data[0];
  pfVar7 = local_c8;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[8] = 0.0;
  pfVar9 = &local_98;
  lVar10 = 0;
  do {
    lVar12 = 0;
    pfVar11 = pfVar7;
    do {
      *pfVar11 = pfVar9[lVar12];
      lVar12 = lVar12 + 1;
      pfVar11 = pfVar11 + 3;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    pfVar9 = pfVar9 + 3;
    pfVar7 = pfVar7 + 1;
  } while (lVar10 != 3);
  fVar2 = (mat->m_data).m_data[1].m_data[0];
  pfVar7 = local_f8;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[8] = 0.0;
  lVar10 = 0;
  do {
    lVar12 = 0;
    pfVar9 = pfVar7;
    do {
      *pfVar9 = pfVar8[lVar12];
      lVar12 = lVar12 + 1;
      pfVar9 = pfVar9 + 3;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    pfVar8 = pfVar8 + 3;
    pfVar7 = pfVar7 + 1;
  } while (lVar10 != 3);
  fVar3 = (mat->m_data).m_data[2].m_data[0];
  pfVar7 = local_128;
  local_128[4] = 0.0;
  local_128[5] = 0.0;
  local_128[6] = 0.0;
  local_128[7] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[8] = 0.0;
  lVar10 = 0;
  do {
    lVar12 = 0;
    pfVar8 = pfVar7;
    do {
      *pfVar8 = pfVar6[lVar12];
      lVar12 = lVar12 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    pfVar6 = pfVar6 + 3;
    pfVar7 = pfVar7 + 1;
  } while (lVar10 != 3);
  fVar4 = (mat->m_data).m_data[3].m_data[0];
  pfVar7 = local_158;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[8] = 0.0;
  lVar10 = 0;
  do {
    lVar12 = 0;
    pfVar8 = pfVar7;
    do {
      *pfVar8 = pfVar5[lVar12];
      lVar12 = lVar12 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    pfVar5 = pfVar5 + 3;
    pfVar7 = pfVar7 + 1;
  } while (lVar10 != 3);
  return ((fVar1 * ((((local_c8[6] * local_c8[1] * local_c8[5] +
                      local_c8[0] * local_c8[4] * local_c8[8] +
                      local_c8[3] * local_c8[7] * local_c8[2]) -
                     local_c8[7] * local_c8[0] * local_c8[5]) -
                    local_c8[1] * local_c8[3] * local_c8[8]) -
                   local_c8[4] * local_c8[6] * local_c8[2]) -
          ((((local_f8[6] * local_f8[1] * local_f8[5] +
             local_f8[0] * local_f8[4] * local_f8[8] + local_f8[3] * local_f8[7] * local_f8[2]) -
            local_f8[7] * local_f8[0] * local_f8[5]) - local_f8[1] * local_f8[3] * local_f8[8]) -
          local_f8[4] * local_f8[6] * local_f8[2]) * fVar2) +
         fVar3 * ((((local_128[6] * local_128[1] * local_128[5] +
                    local_128[0] * local_128[4] * local_128[8] +
                    local_128[3] * local_128[7] * local_128[2]) -
                   local_128[7] * local_128[0] * local_128[5]) -
                  local_128[1] * local_128[3] * local_128[8]) -
                 local_128[4] * local_128[6] * local_128[2])) -
         fVar4 * ((((local_158[6] * local_158[1] * local_158[5] +
                    local_158[0] * local_158[4] * local_158[8] +
                    local_158[3] * local_158[7] * local_158[2]) -
                   local_158[7] * local_158[0] * local_158[5]) -
                  local_158[1] * local_158[3] * local_158[8]) -
                 local_158[4] * local_158[6] * local_158[2]);
}

Assistant:

float determinant<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	const float minorMatrices[4][3*3] =
	{
		{
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
		}
	};

	return	+ mat(0,0) * determinant(tcu::Mat3(minorMatrices[0]))
			- mat(0,1) * determinant(tcu::Mat3(minorMatrices[1]))
			+ mat(0,2) * determinant(tcu::Mat3(minorMatrices[2]))
			- mat(0,3) * determinant(tcu::Mat3(minorMatrices[3]));
}